

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavParser.cpp
# Opt level: O1

void __thiscall WavParser::Initialize(WavParser *this,ifstream *in_File)

{
  WavHeaderSubType WVar1;
  WavDataType WVar2;
  WavHeaderTypeGroup WVar3;
  WavFile *__p;
  IWavHeader *pIVar4;
  undefined **ppuVar5;
  
  if (((byte)in_File[*(long *)(*(long *)in_File + -0x18) + 0x20] & 5) != 0) {
    __assert_fail("in_File",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jazzlost[P]WavParser/Src/WavParser.cpp"
                  ,0xe,"void WavParser::Initialize(std::ifstream &)");
  }
  WVar3 = WavParserHelper::GetWavHeaderType(in_File);
  this->m_HeaderTypeGroup = WVar3;
  WVar2 = WavParserHelper::GetWavDataType(in_File);
  this->m_DataType = WVar2;
  if (WVar2 == Invalid) {
    return;
  }
  if ((this->m_HeaderTypeGroup).MajorType == Invalid) {
    return;
  }
  __p = (WavFile *)operator_new(0x20);
  __p->Header = (IWavHeader *)0x0;
  (__p->WavData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->WavData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->WavData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<WavFile,_(__gnu_cxx::_Lock_policy)2>::reset<WavFile>
            (&(this->m_File).super___shared_ptr<WavFile,_(__gnu_cxx::_Lock_policy)2>,__p);
  switch((this->m_HeaderTypeGroup).MajorType) {
  case Standard:
    pIVar4 = (IWavHeader *)operator_new(0x4c);
    pIVar4->type = Standard;
    ppuVar5 = &PTR__IWavHeader_0010ebf8;
    break;
  case NonPCM:
    if ((this->m_HeaderTypeGroup).SubType != Normal) {
      return;
    }
    pIVar4 = (IWavHeader *)operator_new(0x62);
    pIVar4->type = NonPCM;
    ppuVar5 = &PTR__IWavHeader_0010ec38;
    break;
  case Extensible:
    WVar1 = (this->m_HeaderTypeGroup).SubType;
    if (WVar1 == NoFact) {
      pIVar4 = (IWavHeader *)operator_new(0x68);
      pIVar4->type = Extensible;
      ppuVar5 = &PTR__IWavHeader_0010ec78;
    }
    else {
      if (WVar1 != Normal) {
        return;
      }
      pIVar4 = (IWavHeader *)operator_new(0x7c);
      pIVar4->type = Extensible;
      ppuVar5 = &PTR__IWavHeader_0010ec58;
    }
    break;
  case Bwf:
    WVar1 = (this->m_HeaderTypeGroup).SubType;
    if (WVar1 == RF64) {
      pIVar4 = (IWavHeader *)operator_new(0x31c);
      pIVar4->type = Bwf;
      pIVar4->_vptr_IWavHeader = (_func_int **)&PTR__IWavHeader_0010ecd8;
      *(undefined2 *)((long)&pIVar4[0x2a]._vptr_IWavHeader + 6) = 0;
    }
    else if (WVar1 == Extensible) {
      pIVar4 = (IWavHeader *)operator_new(0x342);
      pIVar4->type = Bwf;
      pIVar4->_vptr_IWavHeader = (_func_int **)&PTR__IWavHeader_0010ecb8;
      *(undefined2 *)((long)&pIVar4[0x26]._vptr_IWavHeader + 6) = 0;
    }
    else {
      if (WVar1 != Normal) {
        return;
      }
      pIVar4 = (IWavHeader *)operator_new(0x312);
      pIVar4->type = Bwf;
      pIVar4->_vptr_IWavHeader = (_func_int **)&PTR__IWavHeader_0010ec98;
      *(undefined2 *)((long)&pIVar4[0x22]._vptr_IWavHeader + 6) = 0;
    }
    goto LAB_00108eb5;
  default:
    pIVar4 = (IWavHeader *)0x0;
    goto LAB_00108eb5;
  }
  pIVar4->_vptr_IWavHeader = (_func_int **)ppuVar5;
LAB_00108eb5:
  ((this->m_File).super___shared_ptr<WavFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->Header = pIVar4;
  return;
}

Assistant:

void WavParser::Initialize(std::ifstream &in_File)
{
	assert(in_File);

	m_HeaderTypeGroup = WavParserHelper::GetWavHeaderType(in_File);

	m_DataType = WavParserHelper::GetWavDataType(in_File);

	if (m_HeaderTypeGroup.MajorType == WavHeaderType::Invalid || m_DataType == WavDataType::Invalid)
		return;

	m_File.reset(new WavFile());

	switch (m_HeaderTypeGroup.MajorType)
	{
	case WavHeaderType::Standard:
		m_File->Header = new StandardWavHead();
		break;
	case WavHeaderType::NonPCM:
		if (m_HeaderTypeGroup.SubType == WavHeaderSubType::Normal)
			m_File->Header = new NonPcmHead();
		//else if (m_HeaderTypeGroup.SubType == WavHeaderSubType::Extensible)
		//	m_File->Header = new ExtensibleNonPCMHead();
		break;
	case WavHeaderType::Extensible:
		if (m_HeaderTypeGroup.SubType == WavHeaderSubType::Normal)
			m_File->Header = new ExtensibleWavHead();
		else if (m_HeaderTypeGroup.SubType == WavHeaderSubType::NoFact)
			m_File->Header = new ExtensibleNoFactHead();
		break;
	case WavHeaderType::Bwf:
		if (m_HeaderTypeGroup.SubType == WavHeaderSubType::Normal)
			m_File->Header = new StandardBWFHead();
		else if (m_HeaderTypeGroup.SubType == WavHeaderSubType::Extensible)
			m_File->Header = new ExtensibleBWFHead();
		else if (m_HeaderTypeGroup.SubType == WavHeaderSubType::RF64)
			m_File->Header = new RF64Header();
		break;
	default:
		m_File->Header = nullptr;
	}

	return;
}